

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O1

int Cudd_EpdCountMinterm(DdManager *manager,DdNode *node,int nvars,EpDouble *epd)

{
  int iVar1;
  st__table *table;
  EpDouble max;
  EpDouble tmp;
  EpDouble EStack_48;
  EpDouble local_38;
  
  background = manager->background;
  zero = (DdNode *)((ulong)manager->one ^ 1);
  EpdPow2(nvars,&EStack_48);
  table = st__init_table(EpdCmp,st__ptrhash);
  if (table != (st__table *)0x0) {
    iVar1 = ddEpdCountMintermAux((DdNode *)((ulong)node & 0xfffffffffffffffe),&EStack_48,epd,table);
    st__foreach(table,ddEpdFree,(char *)0x0);
    st__free_table(table);
    if (iVar1 != -1) {
      if (((ulong)node & 1) == 0) {
        return 0;
      }
      EpdSubtract3(&EStack_48,epd,&local_38);
      EpdCopy(&local_38,epd);
      return 0;
    }
  }
  EpdMakeZero(epd,0);
  return -1;
}

Assistant:

int
Cudd_EpdCountMinterm(
  DdManager * manager,
  DdNode * node,
  int  nvars,
  EpDouble * epd)
{
    EpDouble    max, tmp;
    st__table    *table;
    int         status;

    background = manager->background;
    zero = Cudd_Not(manager->one);

    EpdPow2(nvars, &max);
    table = st__init_table(EpdCmp, st__ptrhash);
    if (table == NULL) {
        EpdMakeZero(epd, 0);
        return(CUDD_OUT_OF_MEM);
    }
    status = ddEpdCountMintermAux(Cudd_Regular(node),&max,epd,table);
    st__foreach(table, ddEpdFree, NULL);
    st__free_table(table);
    if (status == CUDD_OUT_OF_MEM) {
        EpdMakeZero(epd, 0);
        return(CUDD_OUT_OF_MEM);
    }
    if (Cudd_IsComplement(node)) {
        EpdSubtract3(&max, epd, &tmp);
        EpdCopy(&tmp, epd);
    }
    return(0);

}